

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O0

size_t fs_get_blksize(string_view path)

{
  string_view path_00;
  int iVar1;
  const_pointer pvVar2;
  int *piVar3;
  string_view local_1d8;
  size_t local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  stat s;
  statx sx;
  undefined1 auStack_20 [4];
  int r;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_20 = path._M_len;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  iVar1 = statx(0xffffff9c,pvVar2,0x900,0x7ff,s.__glibc_reserved + 2);
  if (iVar1 == 0) {
    path_local._M_str = (char *)(ulong)s.__glibc_reserved[2]._4_4_;
  }
  else {
    if ((iVar1 == 0) || (piVar3 = __errno_location(), *piVar3 == 0x26)) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      iVar1 = stat(pvVar2,(stat *)local_1b8);
      if (iVar1 == 0) {
        return s.st_size;
      }
    }
    local_1c8 = _auStack_20;
    local_1c0 = (char *)path_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d8,"fs_get_blksize");
    path_00._M_str = local_1c0;
    path_00._M_len = local_1c8;
    fs_print_error(path_00,local_1d8);
    path_local._M_str = (char *)0x0;
  }
  return (size_t)path_local._M_str;
}

Assistant:

std::size_t fs_get_blksize(std::string_view path)
{
  // block size in bytes
#if defined(_WIN32)

  const std::string root = fs_root_name(path);
  if (root.empty())
    return {};

  const std::string wp = R"(\\.\)" + root;

  HANDLE h = CreateFileA(wp.data(), 0, 0, nullptr, OPEN_EXISTING, 0, nullptr);
  if (h != INVALID_HANDLE_VALUE) {
    DISK_GEOMETRY_EX diskGeometry = {};
    ZeroMemory(&diskGeometry, sizeof(DISK_GEOMETRY_EX));
    DWORD bytesReturned = 0;

    bool const ok = DeviceIoControl(h, IOCTL_DISK_GET_DRIVE_GEOMETRY_EX,
                        nullptr, 0, &diskGeometry, sizeof(diskGeometry),
                        &bytesReturned, nullptr);

    if (CloseHandle(h) && ok)  FFS_LIKELY
      return diskGeometry.Geometry.BytesPerSector;
  }

#else

  int r = 0;

#if defined(STATX_BASIC_STATS) && defined(USE_STATX)
  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT | AT_SYMLINK_NOFOLLOW, STATX_BASIC_STATS, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_blksize;
#endif

  if (r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_blksize;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}